

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_compress_advanced
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,ZSTD_parameters params)

{
  undefined4 in_EAX;
  int iVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  
  auVar3._0_4_ = -(uint)(0x7fffffe9 < (int)(params.cParams.windowLog - 0x20 ^ 0x80000000));
  auVar3._4_4_ = -(uint)(0x7fffffe6 < (int)(params.cParams.chainLog - 0x1f ^ 0x80000000));
  auVar3._8_4_ = -(uint)(0x7fffffe6 < (int)(params.cParams.hashLog - 0x1f ^ 0x80000000));
  auVar3._12_4_ = -(uint)(0x7fffffe1 < (int)(params.cParams.searchLog - 0x1f ^ 0x80000000));
  iVar1 = movmskps(in_EAX,auVar3);
  if ((((iVar1 == 0xf) && (params.cParams.minMatch - 3 < 5)) &&
      (params.cParams.targetLength < 0x20001)) && (params.cParams.strategy - ZSTD_fast < 9)) {
    ZSTD_CCtxParams_init_internal(&cctx->simpleApiParams,&params,0);
    sVar2 = ZSTD_compress_advanced_internal
                      (cctx,dst,dstCapacity,src,srcSize,dict,dictSize,&cctx->simpleApiParams);
  }
  else {
    sVar2 = 0xffffffffffffffd6;
  }
  return sVar2;
}

Assistant:

size_t ZSTD_compress_advanced (ZSTD_CCtx* cctx,
                               void* dst, size_t dstCapacity,
                         const void* src, size_t srcSize,
                         const void* dict,size_t dictSize,
                               ZSTD_parameters params)
{
    DEBUGLOG(4, "ZSTD_compress_advanced");
    FORWARD_IF_ERROR(ZSTD_checkCParams(params.cParams), "");
    ZSTD_CCtxParams_init_internal(&cctx->simpleApiParams, &params, ZSTD_NO_CLEVEL);
    return ZSTD_compress_advanced_internal(cctx,
                                           dst, dstCapacity,
                                           src, srcSize,
                                           dict, dictSize,
                                           &cctx->simpleApiParams);
}